

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

QCommandLinkButtonPrivate * __thiscall
QCommandLinkButtonPrivate::titleFont(QCommandLinkButtonPrivate *this)

{
  undefined4 uVar1;
  bool bVar2;
  QWidget *this_00;
  QFont *pQVar3;
  QCommandLinkButtonPrivate *in_RSI;
  QCommandLinkButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  int resolve_mask;
  QCommandLinkButton *q;
  QFont *modifiedFont;
  QFont font;
  undefined1 in_stack_ffffffffffffffaf;
  QCommandLinkButtonPrivate *this_01;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QWidget *)q_func(in_RSI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QWidget::font(this_00);
  QFont::QFont((QFont *)&local_18,pQVar3);
  bVar2 = usingVistaStyle(this_01);
  if (bVar2) {
    QFont::setPointSizeF(12.0);
  }
  else {
    QFont::setBold((QFont *)in_RDI,(bool)in_stack_ffffffffffffffaf);
    QFont::setPointSizeF(9.0);
  }
  uVar1 = local_10._0_4_;
  *(undefined1 **)
   &(in_RDI->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(in_RDI->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  QWidget::font(this_00);
  QFont::resolve((QFont *)in_RDI);
  QFont::detach();
  *(undefined4 *)
   &(in_RDI->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x8 =
       uVar1;
  QFont::~QFont((QFont *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QFont QCommandLinkButtonPrivate::titleFont() const
{
    Q_Q(const QCommandLinkButton);
    QFont font = q->font();
    if (usingVistaStyle()) {
        font.setPointSizeF(12.0);
    } else {
        font.setBold(true);
        font.setPointSizeF(9.0);
    }

    // Note the font will be resolved against
    // QPainters font, so we need to restore the mask
    int resolve_mask = font.resolve_mask;
    QFont modifiedFont = q->font().resolve(font);
    modifiedFont.detach();
    modifiedFont.resolve_mask = resolve_mask;
    return modifiedFont;
}